

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

uint Catch::rngSeed(void)

{
  uint uVar1;
  
  if (Context::currentContext == (undefined8 *)0x0) {
    Context::currentContext = (undefined8 *)operator_new(0x10);
    *Context::currentContext = 0;
    Context::currentContext[1] = 0;
  }
  uVar1 = (**(code **)(*(long *)*Context::currentContext + 0x88))();
  return uVar1;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }